

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O2

void __thiscall
ipx::Crossover::PushPrimal
          (Crossover *this,Basis *basis,Vector *x,vector<int,_std::allocator<int>_> *variables,
          Vector *z,Info *info)

{
  valarray<bool> bound_restrict;
  valarray<bool> local_50;
  _Expr<std::__detail::_BinClos<std::__not_equal_to,_std::_ValArray,_std::_Constant,_double,_double>,_bool>
  local_40;
  
  local_40._M_closure.super__BinBase2<std::__not_equal_to,_std::valarray<double>_>._M_expr2 = 0.0;
  local_40._M_closure.super__BinBase2<std::__not_equal_to,_std::valarray<double>_>._M_expr1 = z;
  std::valarray<bool>::
  valarray<std::__detail::_BinClos<std::__not_equal_to,std::_ValArray,std::_Constant,double,double>>
            (&local_50,&local_40);
  PushPrimal(this,basis,x,variables,local_50._M_data,info);
  operator_delete(local_50._M_data);
  return;
}

Assistant:

void Crossover::PushPrimal(Basis* basis, Vector& x,
                           const std::vector<Int>& variables,
                           const Vector& z, Info* info) {
    std::valarray<bool> bound_restrict = z != 0.0;
    PushPrimal(basis, x, variables, &bound_restrict[0], info);
}